

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi_tests.cpp
# Opt level: O0

void __thiscall test::spi_test::SPITest::FatalFailure2_Sub(SPITest *this,int *count)

{
  bool bVar1;
  char *pcVar2;
  AssertionHelper local_9e60;
  Fixed local_9e30;
  anon_class_8_1_8991fb9c local_9ca8;
  undefined1 local_9ca0 [8];
  AssertionResult iutest_spi_ar_82;
  Fixed local_9c48;
  anon_class_8_1_8991fb9c local_9ac0;
  undefined1 local_9ab8 [8];
  AssertionResult iutest_spi_ar_81;
  Fixed local_9a60;
  anon_class_1_0_00000001 local_98d1;
  undefined1 local_98d0 [8];
  AssertionResult iutest_spi_ar_80;
  Fixed local_9878;
  anon_class_1_0_00000001 local_96e9;
  undefined1 local_96e8 [8];
  AssertionResult iutest_spi_ar_79;
  Fixed local_9690;
  anon_class_8_1_8991fb9c local_9508;
  undefined1 local_9500 [8];
  AssertionResult iutest_spi_ar_78;
  Fixed local_94a8;
  anon_class_1_0_00000001 local_9319;
  undefined1 local_9318 [8];
  AssertionResult iutest_spi_ar_77;
  Fixed local_92c0;
  anon_class_1_0_00000001 local_9131;
  undefined1 local_9130 [8];
  AssertionResult iutest_spi_ar_76;
  Fixed local_90d8;
  anon_class_8_1_8991fb9c local_8f50;
  undefined1 local_8f48 [8];
  AssertionResult iutest_spi_ar_75;
  Fixed local_8ef0;
  anon_class_1_0_00000001 local_8d61;
  undefined1 local_8d60 [8];
  AssertionResult iutest_spi_ar_74;
  Fixed local_8d08;
  anon_class_1_0_00000001 local_8b79;
  undefined1 local_8b78 [8];
  AssertionResult iutest_spi_ar_73;
  Fixed local_8b20;
  anon_class_8_1_8991fb9c local_8998;
  undefined1 local_8990 [8];
  AssertionResult iutest_spi_ar_72;
  Fixed local_8938;
  anon_class_8_1_8991fb9c local_87b0;
  undefined1 local_87a8 [8];
  AssertionResult iutest_spi_ar_71;
  Fixed local_8750;
  anon_class_8_1_8991fb9c local_85c8;
  undefined1 local_85c0 [8];
  AssertionResult iutest_spi_ar_70;
  Fixed local_8568;
  anon_class_8_1_8991fb9c local_83e0;
  undefined1 local_83d8 [8];
  AssertionResult iutest_spi_ar_69;
  Fixed local_8380;
  anon_class_8_1_8991fb9c local_81f8;
  undefined1 local_81f0 [8];
  AssertionResult iutest_spi_ar_68;
  Fixed local_8198;
  anon_class_8_1_8991fb9c local_8010;
  undefined1 local_8008 [8];
  AssertionResult iutest_spi_ar_67;
  Fixed local_7fb0;
  anon_class_8_1_8991fb9c local_7e28;
  undefined1 local_7e20 [8];
  AssertionResult iutest_spi_ar_66;
  Fixed local_7dc8;
  anon_class_8_1_8991fb9c local_7c40;
  undefined1 local_7c38 [8];
  AssertionResult iutest_spi_ar_65;
  Fixed local_7be0;
  anon_class_8_1_8991fb9c local_7a58;
  undefined1 local_7a50 [8];
  AssertionResult iutest_spi_ar_64;
  Fixed local_79f8;
  anon_class_1_0_00000001 local_7869;
  undefined1 local_7868 [8];
  AssertionResult iutest_spi_ar_63;
  Fixed local_7810;
  anon_class_1_0_00000001 local_7681;
  undefined1 local_7680 [8];
  AssertionResult iutest_spi_ar_62;
  Fixed local_7628;
  anon_class_8_1_8991fb9c local_74a0;
  undefined1 local_7498 [8];
  AssertionResult iutest_spi_ar_61;
  Fixed local_7440;
  anon_class_8_1_8991fb9c local_72b8;
  undefined1 local_72b0 [8];
  AssertionResult iutest_spi_ar_60;
  Fixed local_7258;
  anon_class_1_0_00000001 local_70c9;
  undefined1 local_70c8 [8];
  AssertionResult iutest_spi_ar_59;
  Fixed local_7070;
  anon_class_1_0_00000001 local_6ee1;
  undefined1 local_6ee0 [8];
  AssertionResult iutest_spi_ar_58;
  Fixed local_6e88;
  anon_class_1_0_00000001 local_6cf9;
  undefined1 local_6cf8 [8];
  AssertionResult iutest_spi_ar_57;
  Fixed local_6ca0;
  anon_class_1_0_00000001 local_6b11;
  undefined1 local_6b10 [8];
  AssertionResult iutest_spi_ar_56;
  Fixed local_6ab8;
  anon_class_1_0_00000001 local_6929;
  undefined1 local_6928 [8];
  AssertionResult iutest_spi_ar_55;
  Fixed local_68d0;
  anon_class_1_0_00000001 local_6741;
  undefined1 local_6740 [8];
  AssertionResult iutest_spi_ar_54;
  Fixed local_66e8;
  anon_class_1_0_00000001 local_6559;
  undefined1 local_6558 [8];
  AssertionResult iutest_spi_ar_53;
  Fixed local_6500;
  anon_class_1_0_00000001 local_6371;
  undefined1 local_6370 [8];
  AssertionResult iutest_spi_ar_52;
  Fixed local_6318;
  anon_class_8_1_8991fb9c local_6190;
  undefined1 local_6188 [8];
  AssertionResult iutest_spi_ar_51;
  Fixed local_6130;
  anon_class_8_1_8991fb9c local_5fa8;
  undefined1 local_5fa0 [8];
  AssertionResult iutest_spi_ar_50;
  Fixed local_5f48;
  anon_class_8_1_8991fb9c local_5dc0;
  undefined1 local_5db8 [8];
  AssertionResult iutest_spi_ar_49;
  Fixed local_5d60;
  anon_class_8_1_8991fb9c local_5bd8;
  undefined1 local_5bd0 [8];
  AssertionResult iutest_spi_ar_48;
  Fixed local_5b78;
  anon_class_1_0_00000001 local_59e9;
  undefined1 local_59e8 [8];
  AssertionResult iutest_spi_ar_47;
  Fixed local_5990;
  anon_class_1_0_00000001 local_5801;
  undefined1 local_5800 [8];
  AssertionResult iutest_spi_ar_46;
  Fixed local_57a8;
  anon_class_1_0_00000001 local_5619;
  undefined1 local_5618 [8];
  AssertionResult iutest_spi_ar_45;
  Fixed local_55c0;
  anon_class_8_1_8991fb9c local_5438;
  undefined1 local_5430 [8];
  AssertionResult iutest_spi_ar_44;
  Fixed local_53d8;
  anon_class_8_1_8991fb9c local_5250;
  undefined1 local_5248 [8];
  AssertionResult iutest_spi_ar_43;
  Fixed local_51f0;
  anon_class_8_1_8991fb9c local_5068;
  undefined1 local_5060 [8];
  AssertionResult iutest_spi_ar_42;
  Fixed local_5008;
  anon_class_8_1_8991fb9c local_4e80;
  undefined1 local_4e78 [8];
  AssertionResult iutest_spi_ar_41;
  Fixed local_4e20;
  anon_class_8_1_8991fb9c local_4c98;
  undefined1 local_4c90 [8];
  AssertionResult iutest_spi_ar_40;
  Fixed local_4c38;
  anon_class_1_0_00000001 local_4aa9;
  undefined1 local_4aa8 [8];
  AssertionResult iutest_spi_ar_39;
  Fixed local_4a50;
  anon_class_1_0_00000001 local_48c1;
  undefined1 local_48c0 [8];
  AssertionResult iutest_spi_ar_38;
  Fixed local_4868;
  anon_class_8_1_8991fb9c local_46e0;
  undefined1 local_46d8 [8];
  AssertionResult iutest_spi_ar_37;
  Fixed local_4680;
  anon_class_8_1_8991fb9c local_44f8;
  undefined1 local_44f0 [8];
  AssertionResult iutest_spi_ar_36;
  Fixed local_4498;
  anon_class_8_1_8991fb9c local_4310;
  undefined1 local_4308 [8];
  AssertionResult iutest_spi_ar_35;
  Fixed local_42b0;
  anon_class_8_1_8991fb9c local_4128;
  undefined1 local_4120 [8];
  AssertionResult iutest_spi_ar_34;
  Fixed local_40c8;
  anon_class_8_1_8991fb9c local_3f40;
  undefined1 local_3f38 [8];
  AssertionResult iutest_spi_ar_33;
  Fixed local_3ee0;
  anon_class_8_1_8991fb9c local_3d58;
  undefined1 local_3d50 [8];
  AssertionResult iutest_spi_ar_32;
  Fixed local_3cf8;
  anon_class_1_0_00000001 local_3b69;
  undefined1 local_3b68 [8];
  AssertionResult iutest_spi_ar_31;
  Fixed local_3b10;
  anon_class_1_0_00000001 local_3981;
  undefined1 local_3980 [8];
  AssertionResult iutest_spi_ar_30;
  Fixed local_3928;
  anon_class_8_1_8991fb9c local_37a0;
  undefined1 local_3798 [8];
  AssertionResult iutest_spi_ar_29;
  Fixed local_3740;
  anon_class_8_1_8991fb9c local_35b8;
  undefined1 local_35b0 [8];
  AssertionResult iutest_spi_ar_28;
  Fixed local_3558;
  anon_class_8_1_8991fb9c local_33d0;
  undefined1 local_33c8 [8];
  AssertionResult iutest_spi_ar_27;
  Fixed local_3370;
  anon_class_1_0_00000001 local_31e1;
  undefined1 local_31e0 [8];
  AssertionResult iutest_spi_ar_26;
  Fixed local_3188;
  anon_class_8_1_8991fb9c local_3000;
  undefined1 local_2ff8 [8];
  AssertionResult iutest_spi_ar_25;
  Fixed local_2fa0;
  anon_class_8_1_8991fb9c local_2e18;
  undefined1 local_2e10 [8];
  AssertionResult iutest_spi_ar_24;
  Fixed local_2db8;
  anon_class_1_0_00000001 local_2c29;
  undefined1 local_2c28 [8];
  AssertionResult iutest_spi_ar_23;
  Fixed local_2bd0;
  anon_class_1_0_00000001 local_2a41;
  undefined1 local_2a40 [8];
  AssertionResult iutest_spi_ar_22;
  Fixed local_29e8;
  anon_class_1_0_00000001 local_2859;
  undefined1 local_2858 [8];
  AssertionResult iutest_spi_ar_21;
  Fixed local_2800;
  anon_class_8_1_8991fb9c local_2678;
  undefined1 local_2670 [8];
  AssertionResult iutest_spi_ar_20;
  Fixed local_2618;
  anon_class_1_0_00000001 local_2489;
  undefined1 local_2488 [8];
  AssertionResult iutest_spi_ar_19;
  Fixed local_2430;
  anon_class_1_0_00000001 local_22a1;
  undefined1 local_22a0 [8];
  AssertionResult iutest_spi_ar_18;
  Fixed local_2248;
  anon_class_1_0_00000001 local_20b9;
  undefined1 local_20b8 [8];
  AssertionResult iutest_spi_ar_17;
  Fixed local_2060;
  anon_class_8_1_8991fb9c local_1ed8;
  undefined1 local_1ed0 [8];
  AssertionResult iutest_spi_ar_16;
  Fixed local_1e78;
  anon_class_8_1_8991fb9c local_1cf0;
  undefined1 local_1ce8 [8];
  AssertionResult iutest_spi_ar_15;
  Fixed local_1c90;
  anon_class_1_0_00000001 local_1b01;
  undefined1 local_1b00 [8];
  AssertionResult iutest_spi_ar_14;
  Fixed local_1aa8;
  anon_class_1_0_00000001 local_1919;
  undefined1 local_1918 [8];
  AssertionResult iutest_spi_ar_13;
  Fixed local_18c0;
  anon_class_1_0_00000001 local_1731;
  undefined1 local_1730 [8];
  AssertionResult iutest_spi_ar_12;
  Fixed local_16d8;
  anon_class_1_0_00000001 local_1549;
  undefined1 local_1548 [8];
  AssertionResult iutest_spi_ar_11;
  Fixed local_14f0;
  anon_class_1_0_00000001 local_1361;
  undefined1 local_1360 [8];
  AssertionResult iutest_spi_ar_10;
  Fixed local_1308;
  anon_class_1_0_00000001 local_1179;
  undefined1 local_1178 [8];
  AssertionResult iutest_spi_ar_9;
  Fixed local_1120;
  anon_class_1_0_00000001 local_f91;
  undefined1 local_f90 [8];
  AssertionResult iutest_spi_ar_8;
  Fixed local_f38;
  anon_class_1_0_00000001 local_da9;
  undefined1 local_da8 [8];
  AssertionResult iutest_spi_ar_7;
  Fixed local_d50;
  anon_class_8_1_8991fb9c local_bc8;
  undefined1 local_bc0 [8];
  AssertionResult iutest_spi_ar_6;
  Fixed local_b68;
  anon_class_8_1_8991fb9c local_9e0;
  undefined1 local_9d8 [8];
  AssertionResult iutest_spi_ar_5;
  Fixed local_980;
  anon_class_8_1_8991fb9c local_7f8;
  undefined1 local_7f0 [8];
  AssertionResult iutest_spi_ar_4;
  Fixed local_798;
  anon_class_1_0_00000001 local_609;
  undefined1 local_608 [8];
  AssertionResult iutest_spi_ar_3;
  Fixed local_5b0;
  anon_class_1_0_00000001 local_421;
  undefined1 local_420 [8];
  AssertionResult iutest_spi_ar_2;
  Fixed local_3c8;
  anon_class_1_0_00000001 local_239;
  undefined1 local_238 [8];
  AssertionResult iutest_spi_ar_1;
  Fixed local_1e0;
  anon_class_1_0_00000001 local_41;
  undefined1 local_40 [8];
  AssertionResult iutest_spi_ar;
  int *count_local;
  SPITest *this_local;
  
  iutest_spi_ar._32_8_ = count;
  iutest::detail::AlwaysZero();
  FatalFailure2_Sub::anon_class_1_0_00000001::operator()((AssertionResult *)local_40,&local_41);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    memset(&local_1e0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1e0);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_40);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_1.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x1e,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_1.m_result,&local_1e0);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_1.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1e0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  iutest::detail::AlwaysZero();
  FatalFailure2_Sub::anon_class_1_0_00000001::operator()((AssertionResult *)local_238,&local_239);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
  if (!bVar1) {
    memset(&local_3c8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_3c8);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_238);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_2.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x1f,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_2.m_result,&local_3c8);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_2.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_3c8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_238);
  iutest::detail::AlwaysZero();
  FatalFailure2_Sub::anon_class_1_0_00000001::operator()((AssertionResult *)local_420,&local_421);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_420);
  if (!bVar1) {
    memset(&local_5b0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_5b0);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_420);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_3.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x20,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_3.m_result,&local_5b0);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_3.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_5b0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_420);
  iutest::detail::AlwaysZero();
  FatalFailure2_Sub::anon_class_1_0_00000001::operator()((AssertionResult *)local_608,&local_609);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_608);
  if (!bVar1) {
    memset(&local_798,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_798);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_608);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_4.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x21,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_4.m_result,&local_798);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_4.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_798);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_608);
  iutest::detail::AlwaysZero();
  local_7f8.this = this;
  FatalFailure2_Sub::anon_class_8_1_8991fb9c::operator()((AssertionResult *)local_7f0,&local_7f8);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7f0);
  if (!bVar1) {
    memset(&local_980,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_980);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_7f0);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_5.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x22,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_5.m_result,&local_980);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_5.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_980);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_7f0);
  iutest::detail::AlwaysZero();
  local_9e0.this = this;
  FatalFailure2_Sub::anon_class_8_1_8991fb9c::operator()((AssertionResult *)local_9d8,&local_9e0);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9d8);
  if (!bVar1) {
    memset(&local_b68,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_b68);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_9d8);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_6.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x24,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_6.m_result,&local_b68);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_6.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_b68);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_9d8);
  iutest::detail::AlwaysZero();
  local_bc8.this = this;
  FatalFailure2_Sub::anon_class_8_1_8991fb9c::operator()((AssertionResult *)local_bc0,&local_bc8);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bc0);
  if (!bVar1) {
    memset(&local_d50,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_d50);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_bc0);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_7.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x25,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_7.m_result,&local_d50);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_7.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_d50);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_bc0);
  iutest::detail::AlwaysZero();
  FatalFailure2_Sub::anon_class_1_0_00000001::operator()((AssertionResult *)local_da8,&local_da9);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_da8);
  if (!bVar1) {
    memset(&local_f38,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_f38);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_da8);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_8.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x27,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_8.m_result,&local_f38);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_8.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_f38);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_da8);
  iutest::detail::AlwaysZero();
  FatalFailure2_Sub::anon_class_1_0_00000001::operator()((AssertionResult *)local_f90,&local_f91);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f90);
  if (!bVar1) {
    memset(&local_1120,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1120);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_f90);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_9.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x28,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_9.m_result,&local_1120);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_9.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1120);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_f90);
  iutest::detail::AlwaysZero();
  FatalFailure2_Sub::anon_class_1_0_00000001::operator()((AssertionResult *)local_1178,&local_1179);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1178);
  if (!bVar1) {
    memset(&local_1308,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1308);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_1178);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_10.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x29,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_10.m_result,&local_1308);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_10.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1308);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_1178);
  iutest::detail::AlwaysZero();
  FatalFailure2_Sub::anon_class_1_0_00000001::operator()((AssertionResult *)local_1360,&local_1361);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1360);
  if (!bVar1) {
    memset(&local_14f0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_14f0);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_1360);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_11.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x2a,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_11.m_result,&local_14f0);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_11.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_14f0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_1360);
  iutest::detail::AlwaysZero();
  FatalFailure2_Sub::anon_class_1_0_00000001::operator()((AssertionResult *)local_1548,&local_1549);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1548);
  if (!bVar1) {
    memset(&local_16d8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_16d8);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_1548);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_12.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x2b,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_12.m_result,&local_16d8);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_12.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_16d8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_1548);
  iutest::detail::AlwaysZero();
  FatalFailure2_Sub::anon_class_1_0_00000001::operator()((AssertionResult *)local_1730,&local_1731);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1730);
  if (!bVar1) {
    memset(&local_18c0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_18c0);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_1730);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_13.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x2c,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_13.m_result,&local_18c0);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_13.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_18c0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_1730);
  iutest::detail::AlwaysZero();
  FatalFailure2_Sub::anon_class_1_0_00000001::operator()((AssertionResult *)local_1918,&local_1919);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1918);
  if (!bVar1) {
    memset(&local_1aa8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1aa8);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_1918);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_14.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x2e,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_14.m_result,&local_1aa8);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_14.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1aa8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_1918);
  iutest::detail::AlwaysZero();
  FatalFailure2_Sub::anon_class_1_0_00000001::operator()((AssertionResult *)local_1b00,&local_1b01);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b00);
  if (!bVar1) {
    memset(&local_1c90,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1c90);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_1b00);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_15.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x2f,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_15.m_result,&local_1c90);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_15.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1c90);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_1b00);
  iutest::detail::AlwaysZero();
  local_1cf0.this = this;
  FatalFailure2_Sub::anon_class_8_1_8991fb9c::operator()((AssertionResult *)local_1ce8,&local_1cf0);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1ce8);
  if (!bVar1) {
    memset(&local_1e78,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1e78);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_1ce8);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_16.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x30,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_16.m_result,&local_1e78);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_16.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1e78);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_1ce8);
  iutest::detail::AlwaysZero();
  local_1ed8.this = this;
  FatalFailure2_Sub::anon_class_8_1_8991fb9c::operator()((AssertionResult *)local_1ed0,&local_1ed8);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1ed0);
  if (!bVar1) {
    memset(&local_2060,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_2060);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_1ed0);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_17.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x31,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_17.m_result,&local_2060);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_17.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_2060);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_1ed0);
  iutest::detail::AlwaysZero();
  FatalFailure2_Sub::anon_class_1_0_00000001::operator()((AssertionResult *)local_20b8,&local_20b9);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20b8);
  if (!bVar1) {
    memset(&local_2248,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_2248);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_20b8);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_18.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x32,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_18.m_result,&local_2248);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_18.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_2248);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_20b8);
  iutest::detail::AlwaysZero();
  FatalFailure2_Sub::anon_class_1_0_00000001::operator()((AssertionResult *)local_22a0,&local_22a1);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_22a0);
  if (!bVar1) {
    memset(&local_2430,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_2430);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_22a0);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_19.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x33,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_19.m_result,&local_2430);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_19.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_2430);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_22a0);
  iutest::detail::AlwaysZero();
  FatalFailure2_Sub::anon_class_1_0_00000001::operator()((AssertionResult *)local_2488,&local_2489);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2488);
  if (!bVar1) {
    memset(&local_2618,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_2618);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_2488);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_20.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x3d,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_20.m_result,&local_2618);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_20.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_2618);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_2488);
  iutest::detail::AlwaysZero();
  local_2678.this = this;
  FatalFailure2_Sub::anon_class_8_1_8991fb9c::operator()((AssertionResult *)local_2670,&local_2678);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2670);
  if (!bVar1) {
    memset(&local_2800,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_2800);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_2670);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_21.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x3e,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_21.m_result,&local_2800);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_21.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_2800);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_2670);
  iutest::detail::AlwaysZero();
  FatalFailure2_Sub::anon_class_1_0_00000001::operator()((AssertionResult *)local_2858,&local_2859);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2858);
  if (!bVar1) {
    memset(&local_29e8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_29e8);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_2858);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_22.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x41,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_22.m_result,&local_29e8);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_22.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_29e8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_2858);
  iutest::detail::AlwaysZero();
  FatalFailure2_Sub::anon_class_1_0_00000001::operator()((AssertionResult *)local_2a40,&local_2a41);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a40);
  if (!bVar1) {
    memset(&local_2bd0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_2bd0);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_2a40);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_23.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x42,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_23.m_result,&local_2bd0);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_23.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_2bd0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_2a40);
  iutest::detail::AlwaysZero();
  FatalFailure2_Sub::anon_class_1_0_00000001::operator()((AssertionResult *)local_2c28,&local_2c29);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c28);
  if (!bVar1) {
    memset(&local_2db8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_2db8);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_2c28);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_24.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x44,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_24.m_result,&local_2db8);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_24.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_2db8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_2c28);
  iutest::detail::AlwaysZero();
  local_2e18.this = this;
  FatalFailure2_Sub::anon_class_8_1_8991fb9c::operator()((AssertionResult *)local_2e10,&local_2e18);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e10);
  if (!bVar1) {
    memset(&local_2fa0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_2fa0);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_2e10);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_25.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x45,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_25.m_result,&local_2fa0);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_25.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_2fa0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_2e10);
  iutest::detail::AlwaysZero();
  local_3000.this = this;
  FatalFailure2_Sub::anon_class_8_1_8991fb9c::operator()((AssertionResult *)local_2ff8,&local_3000);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2ff8);
  if (!bVar1) {
    memset(&local_3188,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_3188);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_2ff8);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_26.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x46,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_26.m_result,&local_3188);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_26.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_3188);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_2ff8);
  iutest::detail::AlwaysZero();
  FatalFailure2_Sub::anon_class_1_0_00000001::operator()((AssertionResult *)local_31e0,&local_31e1);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_31e0);
  if (!bVar1) {
    memset(&local_3370,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_3370);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_31e0);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_27.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x47,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_27.m_result,&local_3370);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_27.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_3370);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_31e0);
  iutest::detail::AlwaysZero();
  local_33d0.this = this;
  FatalFailure2_Sub::anon_class_8_1_8991fb9c::operator()((AssertionResult *)local_33c8,&local_33d0);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_33c8);
  if (!bVar1) {
    memset(&local_3558,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_3558);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_33c8);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_28.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x48,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_28.m_result,&local_3558);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_28.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_3558);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_33c8);
  iutest::detail::AlwaysZero();
  local_35b8.this = this;
  FatalFailure2_Sub::anon_class_8_1_8991fb9c::operator()((AssertionResult *)local_35b0,&local_35b8);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_35b0);
  if (!bVar1) {
    memset(&local_3740,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_3740);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_35b0);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_29.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x49,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_29.m_result,&local_3740);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_29.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_3740);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_35b0);
  iutest::detail::AlwaysZero();
  local_37a0.this = this;
  FatalFailure2_Sub::anon_class_8_1_8991fb9c::operator()((AssertionResult *)local_3798,&local_37a0);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3798);
  if (!bVar1) {
    memset(&local_3928,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_3928);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_3798);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_30.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x4a,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_30.m_result,&local_3928);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_30.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_3928);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_3798);
  iutest::detail::AlwaysZero();
  FatalFailure2_Sub::anon_class_1_0_00000001::operator()((AssertionResult *)local_3980,&local_3981);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3980);
  if (!bVar1) {
    memset(&local_3b10,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_3b10);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_3980);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_31.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x4b,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_31.m_result,&local_3b10);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_31.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_3b10);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_3980);
  iutest::detail::AlwaysZero();
  FatalFailure2_Sub::anon_class_1_0_00000001::operator()((AssertionResult *)local_3b68,&local_3b69);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b68);
  if (!bVar1) {
    memset(&local_3cf8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_3cf8);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_3b68);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_32.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x4c,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_32.m_result,&local_3cf8);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_32.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_3cf8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_3b68);
  iutest::detail::AlwaysZero();
  local_3d58.this = this;
  FatalFailure2_Sub::anon_class_8_1_8991fb9c::operator()((AssertionResult *)local_3d50,&local_3d58);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d50);
  if (!bVar1) {
    memset(&local_3ee0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_3ee0);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_3d50);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_33.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x4d,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_33.m_result,&local_3ee0);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_33.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_3ee0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_3d50);
  iutest::detail::AlwaysZero();
  local_3f40.this = this;
  FatalFailure2_Sub::anon_class_8_1_8991fb9c::operator()((AssertionResult *)local_3f38,&local_3f40);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f38);
  if (!bVar1) {
    memset(&local_40c8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_40c8);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_3f38);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_34.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x4e,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_34.m_result,&local_40c8);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_34.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_40c8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_3f38);
  iutest::detail::AlwaysZero();
  local_4128.this = this;
  FatalFailure2_Sub::anon_class_8_1_8991fb9c::operator()((AssertionResult *)local_4120,&local_4128);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4120);
  if (!bVar1) {
    memset(&local_42b0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_42b0);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_4120);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_35.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x4f,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_35.m_result,&local_42b0);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_35.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_42b0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_4120);
  iutest::detail::AlwaysZero();
  local_4310.this = this;
  FatalFailure2_Sub::anon_class_8_1_8991fb9c::operator()((AssertionResult *)local_4308,&local_4310);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4308);
  if (!bVar1) {
    memset(&local_4498,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_4498);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_4308);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_36.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x50,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_36.m_result,&local_4498);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_36.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_4498);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_4308);
  iutest::detail::AlwaysZero();
  local_44f8.this = this;
  FatalFailure2_Sub::anon_class_8_1_8991fb9c::operator()((AssertionResult *)local_44f0,&local_44f8);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_44f0);
  if (!bVar1) {
    memset(&local_4680,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_4680);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_44f0);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_37.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x51,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_37.m_result,&local_4680);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_37.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_4680);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_44f0);
  iutest::detail::AlwaysZero();
  local_46e0.this = this;
  FatalFailure2_Sub::anon_class_8_1_8991fb9c::operator()((AssertionResult *)local_46d8,&local_46e0);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_46d8);
  if (!bVar1) {
    memset(&local_4868,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_4868);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_46d8);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_38.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x52,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_38.m_result,&local_4868);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_38.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_4868);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_46d8);
  iutest::detail::AlwaysZero();
  FatalFailure2_Sub::anon_class_1_0_00000001::operator()((AssertionResult *)local_48c0,&local_48c1);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48c0);
  if (!bVar1) {
    memset(&local_4a50,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_4a50);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_48c0);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_39.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x53,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_39.m_result,&local_4a50);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_39.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_4a50);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_48c0);
  iutest::detail::AlwaysZero();
  FatalFailure2_Sub::anon_class_1_0_00000001::operator()((AssertionResult *)local_4aa8,&local_4aa9);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4aa8);
  if (!bVar1) {
    memset(&local_4c38,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_4c38);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_4aa8);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_40.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x55,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_40.m_result,&local_4c38);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_40.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_4c38);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_4aa8);
  iutest::detail::AlwaysZero();
  local_4c98.this = this;
  FatalFailure2_Sub::anon_class_8_1_8991fb9c::operator()((AssertionResult *)local_4c90,&local_4c98);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4c90);
  if (!bVar1) {
    memset(&local_4e20,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_4e20);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_4c90);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_41.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x56,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_41.m_result,&local_4e20);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_41.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_4e20);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_4c90);
  iutest::detail::AlwaysZero();
  local_4e80.this = this;
  FatalFailure2_Sub::anon_class_8_1_8991fb9c::operator()((AssertionResult *)local_4e78,&local_4e80);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e78);
  if (!bVar1) {
    memset(&local_5008,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_5008);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_4e78);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_42.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x57,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_42.m_result,&local_5008);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_42.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_5008);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_4e78);
  iutest::detail::AlwaysZero();
  local_5068.this = this;
  FatalFailure2_Sub::anon_class_8_1_8991fb9c::operator()((AssertionResult *)local_5060,&local_5068);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5060);
  if (!bVar1) {
    memset(&local_51f0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_51f0);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_5060);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_43.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x58,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_43.m_result,&local_51f0);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_43.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_51f0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_5060);
  iutest::detail::AlwaysZero();
  local_5250.this = this;
  FatalFailure2_Sub::anon_class_8_1_8991fb9c::operator()((AssertionResult *)local_5248,&local_5250);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5248);
  if (!bVar1) {
    memset(&local_53d8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_53d8);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_5248);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_44.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x59,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_44.m_result,&local_53d8);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_44.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_53d8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_5248);
  iutest::detail::AlwaysZero();
  local_5438.this = this;
  FatalFailure2_Sub::anon_class_8_1_8991fb9c::operator()((AssertionResult *)local_5430,&local_5438);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5430);
  if (!bVar1) {
    memset(&local_55c0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_55c0);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_5430);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_45.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x5a,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_45.m_result,&local_55c0);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_45.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_55c0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_5430);
  iutest::detail::AlwaysZero();
  FatalFailure2_Sub::anon_class_1_0_00000001::operator()((AssertionResult *)local_5618,&local_5619);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5618);
  if (!bVar1) {
    memset(&local_57a8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_57a8);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_5618);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_46.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x5b,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_46.m_result,&local_57a8);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_46.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_57a8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_5618);
  iutest::detail::AlwaysZero();
  FatalFailure2_Sub::anon_class_1_0_00000001::operator()((AssertionResult *)local_5800,&local_5801);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5800);
  if (!bVar1) {
    memset(&local_5990,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_5990);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_5800);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_47.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x5c,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_47.m_result,&local_5990);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_47.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_5990);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_5800);
  iutest::detail::AlwaysZero();
  FatalFailure2_Sub::anon_class_1_0_00000001::operator()((AssertionResult *)local_59e8,&local_59e9);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_59e8);
  if (!bVar1) {
    memset(&local_5b78,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_5b78);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_59e8);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_48.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x5d,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_48.m_result,&local_5b78);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_48.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_5b78);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_59e8);
  iutest::detail::AlwaysZero();
  local_5bd8.this = this;
  FatalFailure2_Sub::anon_class_8_1_8991fb9c::operator()((AssertionResult *)local_5bd0,&local_5bd8);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5bd0);
  if (!bVar1) {
    memset(&local_5d60,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_5d60);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_5bd0);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_49.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x5e,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_49.m_result,&local_5d60);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_49.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_5d60);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_5bd0);
  iutest::detail::AlwaysZero();
  local_5dc0.this = this;
  FatalFailure2_Sub::anon_class_8_1_8991fb9c::operator()((AssertionResult *)local_5db8,&local_5dc0);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5db8);
  if (!bVar1) {
    memset(&local_5f48,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_5f48);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_5db8);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_50.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x5f,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_50.m_result,&local_5f48);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_50.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_5f48);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_5db8);
  iutest::detail::AlwaysZero();
  local_5fa8.this = this;
  FatalFailure2_Sub::anon_class_8_1_8991fb9c::operator()((AssertionResult *)local_5fa0,&local_5fa8);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5fa0);
  if (!bVar1) {
    memset(&local_6130,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_6130);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_5fa0);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_51.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x60,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_51.m_result,&local_6130);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_51.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_6130);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_5fa0);
  iutest::detail::AlwaysZero();
  local_6190.this = this;
  FatalFailure2_Sub::anon_class_8_1_8991fb9c::operator()((AssertionResult *)local_6188,&local_6190);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6188);
  if (!bVar1) {
    memset(&local_6318,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_6318);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_6188);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_52.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x61,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_52.m_result,&local_6318);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_52.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_6318);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_6188);
  iutest::detail::AlwaysZero();
  FatalFailure2_Sub::anon_class_1_0_00000001::operator()((AssertionResult *)local_6370,&local_6371);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6370);
  if (!bVar1) {
    memset(&local_6500,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_6500);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_6370);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_53.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x62,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_53.m_result,&local_6500);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_53.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_6500);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_6370);
  iutest::detail::AlwaysZero();
  FatalFailure2_Sub::anon_class_1_0_00000001::operator()((AssertionResult *)local_6558,&local_6559);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6558);
  if (!bVar1) {
    memset(&local_66e8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_66e8);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_6558);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_54.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,100,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_54.m_result,&local_66e8);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_54.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_66e8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_6558);
  iutest::detail::AlwaysZero();
  FatalFailure2_Sub::anon_class_1_0_00000001::operator()((AssertionResult *)local_6740,&local_6741);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6740);
  if (!bVar1) {
    memset(&local_68d0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_68d0);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_6740);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_55.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x65,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_55.m_result,&local_68d0);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_55.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_68d0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_6740);
  iutest::detail::AlwaysZero();
  FatalFailure2_Sub::anon_class_1_0_00000001::operator()((AssertionResult *)local_6928,&local_6929);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6928);
  if (!bVar1) {
    memset(&local_6ab8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_6ab8);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_6928);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_56.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x66,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_56.m_result,&local_6ab8);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_56.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_6ab8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_6928);
  iutest::detail::AlwaysZero();
  FatalFailure2_Sub::anon_class_1_0_00000001::operator()((AssertionResult *)local_6b10,&local_6b11);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6b10);
  if (!bVar1) {
    memset(&local_6ca0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_6ca0);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_6b10);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_57.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x67,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_57.m_result,&local_6ca0);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_57.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_6ca0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_6b10);
  iutest::detail::AlwaysZero();
  FatalFailure2_Sub::anon_class_1_0_00000001::operator()((AssertionResult *)local_6cf8,&local_6cf9);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6cf8);
  if (!bVar1) {
    memset(&local_6e88,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_6e88);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_6cf8);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_58.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x68,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_58.m_result,&local_6e88);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_58.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_6e88);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_6cf8);
  iutest::detail::AlwaysZero();
  FatalFailure2_Sub::anon_class_1_0_00000001::operator()((AssertionResult *)local_6ee0,&local_6ee1);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6ee0);
  if (!bVar1) {
    memset(&local_7070,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_7070);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_6ee0);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_59.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x6a,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_59.m_result,&local_7070);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_59.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_7070);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_6ee0);
  iutest::detail::AlwaysZero();
  FatalFailure2_Sub::anon_class_1_0_00000001::operator()((AssertionResult *)local_70c8,&local_70c9);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70c8);
  if (!bVar1) {
    memset(&local_7258,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_7258);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_70c8);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_60.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x73,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_60.m_result,&local_7258);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_60.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_7258);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_70c8);
  iutest::detail::AlwaysZero();
  local_72b8.this = this;
  FatalFailure2_Sub::anon_class_8_1_8991fb9c::operator()((AssertionResult *)local_72b0,&local_72b8);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_72b0);
  if (!bVar1) {
    memset(&local_7440,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_7440);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_72b0);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_61.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x74,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_61.m_result,&local_7440);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_61.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_7440);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_72b0);
  iutest::detail::AlwaysZero();
  local_74a0.this = this;
  FatalFailure2_Sub::anon_class_8_1_8991fb9c::operator()((AssertionResult *)local_7498,&local_74a0);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7498);
  if (!bVar1) {
    memset(&local_7628,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_7628);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_7498);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_62.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x75,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_62.m_result,&local_7628);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_62.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_7628);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_7498);
  iutest::detail::AlwaysZero();
  FatalFailure2_Sub::anon_class_1_0_00000001::operator()((AssertionResult *)local_7680,&local_7681);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7680);
  if (!bVar1) {
    memset(&local_7810,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_7810);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_7680);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_63.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x77,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_63.m_result,&local_7810);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_63.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_7810);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_7680);
  iutest::detail::AlwaysZero();
  FatalFailure2_Sub::anon_class_1_0_00000001::operator()((AssertionResult *)local_7868,&local_7869);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7868);
  if (!bVar1) {
    memset(&local_79f8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_79f8);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_7868);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_64.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x79,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_64.m_result,&local_79f8);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_64.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_79f8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_7868);
  iutest::detail::AlwaysZero();
  local_7a58.this = this;
  FatalFailure2_Sub::anon_class_8_1_8991fb9c::operator()((AssertionResult *)local_7a50,&local_7a58);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7a50);
  if (!bVar1) {
    memset(&local_7be0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_7be0);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_7a50);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_65.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x7a,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_65.m_result,&local_7be0);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_65.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_7be0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_7a50);
  iutest::detail::AlwaysZero();
  local_7c40.this = this;
  FatalFailure2_Sub::anon_class_8_1_8991fb9c::operator()((AssertionResult *)local_7c38,&local_7c40);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7c38);
  if (!bVar1) {
    memset(&local_7dc8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_7dc8);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_7c38);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_66.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x7c,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_66.m_result,&local_7dc8);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_66.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_7dc8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_7c38);
  iutest::detail::AlwaysZero();
  local_7e28.this = this;
  FatalFailure2_Sub::anon_class_8_1_8991fb9c::operator()((AssertionResult *)local_7e20,&local_7e28);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7e20);
  if (!bVar1) {
    memset(&local_7fb0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_7fb0);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_7e20);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_67.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x7d,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_67.m_result,&local_7fb0);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_67.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_7fb0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_7e20);
  iutest::detail::AlwaysZero();
  local_8010.this = this;
  FatalFailure2_Sub::anon_class_8_1_8991fb9c::operator()((AssertionResult *)local_8008,&local_8010);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8008);
  if (!bVar1) {
    memset(&local_8198,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_8198);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_8008);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_68.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x7e,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_68.m_result,&local_8198);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_68.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_8198);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_8008);
  iutest::detail::AlwaysZero();
  local_81f8.this = this;
  FatalFailure2_Sub::anon_class_8_1_8991fb9c::operator()((AssertionResult *)local_81f0,&local_81f8);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_81f0);
  if (!bVar1) {
    memset(&local_8380,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_8380);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_81f0);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_69.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x80,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_69.m_result,&local_8380);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_69.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_8380);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_81f0);
  iutest::detail::AlwaysZero();
  local_83e0.this = this;
  FatalFailure2_Sub::anon_class_8_1_8991fb9c::operator()((AssertionResult *)local_83d8,&local_83e0);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_83d8);
  if (!bVar1) {
    memset(&local_8568,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_8568);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_83d8);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_70.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x82,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_70.m_result,&local_8568);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_70.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_8568);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_83d8);
  iutest::detail::AlwaysZero();
  local_85c8.this = this;
  FatalFailure2_Sub::anon_class_8_1_8991fb9c::operator()((AssertionResult *)local_85c0,&local_85c8);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_85c0);
  if (!bVar1) {
    memset(&local_8750,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_8750);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_85c0);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_71.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x83,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_71.m_result,&local_8750);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_71.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_8750);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_85c0);
  iutest::detail::AlwaysZero();
  local_87b0.this = this;
  FatalFailure2_Sub::anon_class_8_1_8991fb9c::operator()((AssertionResult *)local_87a8,&local_87b0);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_87a8);
  if (!bVar1) {
    memset(&local_8938,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_8938);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_87a8);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_72.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x84,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_72.m_result,&local_8938);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_72.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_8938);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_87a8);
  iutest::detail::AlwaysZero();
  local_8998.this = this;
  FatalFailure2_Sub::anon_class_8_1_8991fb9c::operator()((AssertionResult *)local_8990,&local_8998);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8990);
  if (!bVar1) {
    memset(&local_8b20,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_8b20);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_8990);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_73.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x86,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_73.m_result,&local_8b20);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_73.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_8b20);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_8990);
  iutest::detail::AlwaysZero();
  FatalFailure2_Sub::anon_class_1_0_00000001::operator()((AssertionResult *)local_8b78,&local_8b79);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8b78);
  if (!bVar1) {
    memset(&local_8d08,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_8d08);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_8b78);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_74.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x88,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_74.m_result,&local_8d08);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_74.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_8d08);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_8b78);
  iutest::detail::AlwaysZero();
  FatalFailure2_Sub::anon_class_1_0_00000001::operator()((AssertionResult *)local_8d60,&local_8d61);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8d60);
  if (!bVar1) {
    memset(&local_8ef0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_8ef0);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_8d60);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_75.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x8b,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_75.m_result,&local_8ef0);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_75.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_8ef0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_8d60);
  iutest::detail::AlwaysZero();
  local_8f50.this = this;
  FatalFailure2_Sub::anon_class_8_1_8991fb9c::operator()((AssertionResult *)local_8f48,&local_8f50);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8f48);
  if (!bVar1) {
    memset(&local_90d8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_90d8);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_8f48);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_76.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x8c,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_76.m_result,&local_90d8);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_76.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_90d8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_8f48);
  iutest::detail::AlwaysZero();
  FatalFailure2_Sub::anon_class_1_0_00000001::operator()((AssertionResult *)local_9130,&local_9131);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9130);
  if (!bVar1) {
    memset(&local_92c0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_92c0);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_9130);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_77.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x8d,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_77.m_result,&local_92c0);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_77.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_92c0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_9130);
  iutest::detail::AlwaysZero();
  FatalFailure2_Sub::anon_class_1_0_00000001::operator()((AssertionResult *)local_9318,&local_9319);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9318);
  if (!bVar1) {
    memset(&local_94a8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_94a8);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_9318);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_78.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x8e,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_78.m_result,&local_94a8);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_78.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_94a8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_9318);
  iutest::detail::AlwaysZero();
  local_9508.this = this;
  FatalFailure2_Sub::anon_class_8_1_8991fb9c::operator()((AssertionResult *)local_9500,&local_9508);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9500);
  if (!bVar1) {
    memset(&local_9690,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_9690);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_9500);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_79.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x8f,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_79.m_result,&local_9690);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_79.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_9690);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_9500);
  iutest::detail::AlwaysZero();
  FatalFailure2_Sub::anon_class_1_0_00000001::operator()((AssertionResult *)local_96e8,&local_96e9);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_96e8);
  if (!bVar1) {
    memset(&local_9878,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_9878);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_96e8);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_80.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x90,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_80.m_result,&local_9878);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_80.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_9878);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_96e8);
  iutest::detail::AlwaysZero();
  FatalFailure2_Sub::anon_class_1_0_00000001::operator()((AssertionResult *)local_98d0,&local_98d1);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98d0);
  if (!bVar1) {
    memset(&local_9a60,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_9a60);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_98d0);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_81.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x91,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_81.m_result,&local_9a60);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_81.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_9a60);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_98d0);
  iutest::detail::AlwaysZero();
  local_9ac0.this = this;
  FatalFailure2_Sub::anon_class_8_1_8991fb9c::operator()((AssertionResult *)local_9ab8,&local_9ac0);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9ab8);
  if (!bVar1) {
    memset(&local_9c48,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_9c48);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_9ab8);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_82.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x95,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_82.m_result,&local_9c48);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_82.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_9c48);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_9ab8);
  iutest::detail::AlwaysZero();
  local_9ca8.this = this;
  FatalFailure2_Sub::anon_class_8_1_8991fb9c::operator()((AssertionResult *)local_9ca0,&local_9ca8);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9ca0);
  if (!bVar1) {
    memset(&local_9e30,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_9e30);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_9ca0);
    iutest::AssertionHelper::AssertionHelper
              (&local_9e60,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x96,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_9e60,&local_9e30);
    iutest::AssertionHelper::~AssertionHelper(&local_9e60);
    iutest::AssertionHelper::Fixed::~Fixed(&local_9e30);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_9ca0);
  *(int *)iutest_spi_ar._32_8_ = *(int *)iutest_spi_ar._32_8_ + 1;
  return;
}

Assistant:

void SPITest::FatalFailure2_Sub(int& count)
{
    #define FLAVOR(n) IUTEST_ASSERT##n
    #define FAILURE_MACRO IUTEST_EXPECT_FATAL_FAILURE

#include "spi_tests_decl.cpp"

    #undef FLAVOR
    #undef FAILURE_MACRO

    count++;
}